

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

_Bool scan_bare_dollar(TSLexer *lexer)

{
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  wint_t __wc;
  
  __wc = lexer->lookahead;
  while( true ) {
    iVar3 = iswspace(__wc);
    if (iVar3 == 0) break;
    if (lexer->lookahead == 10) goto LAB_0012812a;
    _Var1 = (*lexer->eof)(lexer);
    if (_Var1) break;
    (*lexer->advance)(lexer,true);
    __wc = lexer->lookahead;
  }
  if (lexer->lookahead == 0x24) {
    (*lexer->advance)(lexer,false);
    lexer->result_symbol = 0xf;
    (*lexer->mark_end)(lexer);
    iVar3 = iswspace(lexer->lookahead);
    _Var1 = true;
    if (iVar3 == 0) {
      _Var2 = (*lexer->eof)(lexer);
      if (!_Var2) {
        _Var1 = lexer->lookahead == 0x22;
      }
    }
  }
  else {
LAB_0012812a:
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static inline bool scan_bare_dollar(TSLexer *lexer) {
    while (iswspace(lexer->lookahead) && lexer->lookahead != '\n' && !lexer->eof(lexer)) {
        skip(lexer);
    }

    if (lexer->lookahead == '$') {
        advance(lexer);
        lexer->result_symbol = BARE_DOLLAR;
        lexer->mark_end(lexer);
        return iswspace(lexer->lookahead) || lexer->eof(lexer) || lexer->lookahead == '\"';
    }

    return false;
}